

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGValidateAttribute(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define)

{
  int *piVar1;
  xmlNodePtr pxVar2;
  int iVar3;
  xmlNs *pxVar4;
  xmlChar *pxVar5;
  xmlRelaxNGValidStatePtr pxVar6;
  xmlAttrPtr in_RDX;
  xmlAttrPtr extraout_RDX;
  xmlChar *pxVar7;
  ulong uVar8;
  xmlChar *local_40;
  xmlNodePtr local_38;
  
  pxVar6 = ctxt->state;
  if (0 < pxVar6->nbAttrLeft) {
    if (define->name == (xmlChar *)0x0) {
      for (uVar8 = 0; (long)uVar8 < (long)pxVar6->nbAttrs; uVar8 = uVar8 + 1) {
        pxVar2 = (xmlNodePtr)pxVar6->attrs[uVar8];
        if (pxVar2 != (xmlNodePtr)0x0) {
          iVar3 = xmlRelaxNGAttributeMatch
                            ((xmlRelaxNGValidCtxtPtr)define,(xmlRelaxNGDefinePtr_conflict)pxVar2,
                             in_RDX);
          if (iVar3 == 1) {
            pxVar5 = xmlNodeListGetString(pxVar2->doc,pxVar2->children,1);
            pxVar6 = ctxt->state;
            local_38 = pxVar6->seq;
            local_40 = pxVar6->value;
            pxVar6->seq = pxVar2;
            pxVar6->value = pxVar5;
            iVar3 = xmlRelaxNGValidateValueContent(ctxt,define->content);
            pxVar6 = ctxt->state;
            pxVar7 = pxVar6->value;
            if (pxVar6->value == (xmlChar *)0x0) {
              pxVar7 = pxVar5;
            }
            goto LAB_00174836;
          }
          pxVar6 = ctxt->state;
          in_RDX = extraout_RDX;
        }
      }
    }
    else {
      for (uVar8 = 0; (long)uVar8 < (long)pxVar6->nbAttrs; uVar8 = uVar8 + 1) {
        pxVar2 = (xmlNodePtr)pxVar6->attrs[uVar8];
        if ((pxVar2 != (xmlNodePtr)0x0) &&
           (iVar3 = xmlStrEqual(define->name,pxVar2->name), iVar3 != 0)) {
          pxVar7 = define->ns;
          if ((pxVar7 == (xmlChar *)0x0) || (*pxVar7 == '\0')) {
            pxVar4 = pxVar2->ns;
            if (pxVar4 == (xmlNs *)0x0) goto LAB_00174791;
          }
          else {
            pxVar4 = pxVar2->ns;
            if (pxVar4 == (xmlNs *)0x0) goto LAB_00174752;
          }
          iVar3 = xmlStrEqual(pxVar7,pxVar4->href);
          if (iVar3 != 0) {
LAB_00174791:
            pxVar5 = xmlNodeListGetString(pxVar2->doc,pxVar2->children,1);
            pxVar6 = ctxt->state;
            local_38 = pxVar6->seq;
            local_40 = pxVar6->value;
            pxVar6->seq = pxVar2;
            pxVar6->value = pxVar5;
            pxVar6->endvalue = (xmlChar *)0x0;
            iVar3 = xmlRelaxNGValidateValueContent(ctxt,define->content);
            pxVar6 = ctxt->state;
            pxVar7 = pxVar6->value;
            if (pxVar6->value == (xmlChar *)0x0) {
              pxVar7 = pxVar5;
            }
LAB_00174836:
            if (pxVar7 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar7);
              pxVar6 = ctxt->state;
            }
            pxVar6->value = local_40;
            pxVar6->seq = local_38;
            if (iVar3 != 0) {
              return iVar3;
            }
            pxVar6->attrs[uVar8 & 0xffffffff] = (xmlAttrPtr)0x0;
            piVar1 = &ctxt->state->nbAttrLeft;
            *piVar1 = *piVar1 + -1;
            return 0;
          }
        }
LAB_00174752:
        pxVar6 = ctxt->state;
      }
    }
  }
  return -1;
}

Assistant:

static int
xmlRelaxNGValidateAttribute(xmlRelaxNGValidCtxtPtr ctxt,
                            xmlRelaxNGDefinePtr define)
{
    int ret = 0, i;
    xmlChar *value, *oldvalue;
    xmlAttrPtr prop = NULL, tmp;
    xmlNodePtr oldseq;

    if (ctxt->state->nbAttrLeft <= 0)
        return (-1);
    if (define->name != NULL) {
        for (i = 0; i < ctxt->state->nbAttrs; i++) {
            tmp = ctxt->state->attrs[i];
            if ((tmp != NULL) && (xmlStrEqual(define->name, tmp->name))) {
                if ((((define->ns == NULL) || (define->ns[0] == 0)) &&
                     (tmp->ns == NULL)) ||
                    ((tmp->ns != NULL) &&
                     (xmlStrEqual(define->ns, tmp->ns->href)))) {
                    prop = tmp;
                    break;
                }
            }
        }
        if (prop != NULL) {
            value = xmlNodeListGetString(prop->doc, prop->children, 1);
            oldvalue = ctxt->state->value;
            oldseq = ctxt->state->seq;
            ctxt->state->seq = (xmlNodePtr) prop;
            ctxt->state->value = value;
            ctxt->state->endvalue = NULL;
            ret = xmlRelaxNGValidateValueContent(ctxt, define->content);
            if (ctxt->state->value != NULL)
                value = ctxt->state->value;
            if (value != NULL)
                xmlFree(value);
            ctxt->state->value = oldvalue;
            ctxt->state->seq = oldseq;
            if (ret == 0) {
                /*
                 * flag the attribute as processed
                 */
                ctxt->state->attrs[i] = NULL;
                ctxt->state->nbAttrLeft--;
            }
        } else {
            ret = -1;
        }
#ifdef DEBUG
        xmlGenericError(xmlGenericErrorContext,
                        "xmlRelaxNGValidateAttribute(%s): %d\n",
                        define->name, ret);
#endif
    } else {
        for (i = 0; i < ctxt->state->nbAttrs; i++) {
            tmp = ctxt->state->attrs[i];
            if ((tmp != NULL) &&
                (xmlRelaxNGAttributeMatch(ctxt, define, tmp) == 1)) {
                prop = tmp;
                break;
            }
        }
        if (prop != NULL) {
            value = xmlNodeListGetString(prop->doc, prop->children, 1);
            oldvalue = ctxt->state->value;
            oldseq = ctxt->state->seq;
            ctxt->state->seq = (xmlNodePtr) prop;
            ctxt->state->value = value;
            ret = xmlRelaxNGValidateValueContent(ctxt, define->content);
            if (ctxt->state->value != NULL)
                value = ctxt->state->value;
            if (value != NULL)
                xmlFree(value);
            ctxt->state->value = oldvalue;
            ctxt->state->seq = oldseq;
            if (ret == 0) {
                /*
                 * flag the attribute as processed
                 */
                ctxt->state->attrs[i] = NULL;
                ctxt->state->nbAttrLeft--;
            }
        } else {
            ret = -1;
        }
#ifdef DEBUG
        if (define->ns != NULL) {
            xmlGenericError(xmlGenericErrorContext,
                            "xmlRelaxNGValidateAttribute(nsName ns = %s): %d\n",
                            define->ns, ret);
        } else {
            xmlGenericError(xmlGenericErrorContext,
                            "xmlRelaxNGValidateAttribute(anyName): %d\n",
                            ret);
        }
#endif
    }

    return (ret);
}